

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O0

void fld_sq(limb_t *res,limb_t *x)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long *in_RSI;
  ulong uVar27;
  ulong *in_RDI;
  llimb_t c [5];
  limb_t tmp;
  limb_t x19_4;
  limb_t x19_3;
  limb_t x2_4;
  limb_t x2_3;
  limb_t x2_2;
  limb_t x2_1;
  
  lVar2 = in_RSI[1] * 2;
  lVar3 = in_RSI[2] * 2;
  lVar4 = in_RSI[3] * 2;
  lVar14 = in_RSI[3] * 0x13;
  lVar5 = in_RSI[4] * 0x13;
  lVar15 = *in_RSI;
  uVar16 = lVar15 * lVar15 + lVar2 * lVar5;
  uVar17 = uVar16 + lVar3 * lVar14;
  lVar6 = SUB168(SEXT816(lVar15) * SEXT816(lVar15),8) + SUB168(SEXT816(lVar2) * SEXT816(lVar5),8) +
          (ulong)CARRY8(lVar15 * lVar15,lVar2 * lVar5) + SUB168(SEXT816(lVar3) * SEXT816(lVar14),8)
          + (ulong)CARRY8(uVar16,lVar3 * lVar14);
  uVar16 = *in_RSI * lVar2;
  uVar18 = uVar16 + lVar3 * lVar5;
  uVar7 = lVar14 * in_RSI[3];
  uVar19 = uVar18 + uVar7;
  lVar15 = in_RSI[1];
  uVar8 = *in_RSI * lVar3;
  uVar20 = uVar8 + lVar15 * lVar15;
  uVar21 = uVar20 + lVar4 * lVar5;
  uVar9 = *in_RSI * lVar4;
  uVar10 = lVar2 * in_RSI[2];
  uVar22 = uVar9 + uVar10;
  uVar11 = lVar5 * in_RSI[4];
  uVar23 = uVar22 + uVar11;
  lVar1 = in_RSI[2];
  uVar12 = *in_RSI * in_RSI[4] * 2;
  uVar13 = lVar2 * in_RSI[3];
  uVar24 = uVar12 + uVar13;
  uVar25 = uVar24 + lVar1 * lVar1;
  uVar27 = lVar6 * 0x2000 | uVar17 >> 0x33;
  uVar26 = uVar19 + uVar27;
  lVar14 = SUB168(SEXT816(*in_RSI) * SEXT816(lVar2),8) + SUB168(SEXT816(lVar3) * SEXT816(lVar5),8) +
           (ulong)CARRY8(uVar16,lVar3 * lVar5) + SUB168(SEXT816(lVar14) * SEXT816(in_RSI[3]),8) +
           (ulong)CARRY8(uVar18,uVar7) + (lVar6 >> 0x33) + (ulong)CARRY8(uVar19,uVar27);
  uVar7 = lVar14 * 0x2000 | uVar26 >> 0x33;
  uVar16 = uVar21 + uVar7;
  lVar15 = SUB168(SEXT816(*in_RSI) * SEXT816(lVar3),8) + SUB168(SEXT816(lVar15) * SEXT816(lVar15),8)
           + (ulong)CARRY8(uVar8,lVar15 * lVar15) + SUB168(SEXT816(lVar4) * SEXT816(lVar5),8) +
           (ulong)CARRY8(uVar20,lVar4 * lVar5) + (lVar14 >> 0x33) + (ulong)CARRY8(uVar21,uVar7);
  uVar8 = lVar15 * 0x2000 | uVar16 >> 0x33;
  uVar7 = uVar23 + uVar8;
  lVar15 = SUB168(SEXT816(*in_RSI) * SEXT816(lVar4),8) +
           SUB168(SEXT816(lVar2) * SEXT816(in_RSI[2]),8) + (ulong)CARRY8(uVar9,uVar10) +
           SUB168(SEXT816(lVar5) * SEXT816(in_RSI[4]),8) + (ulong)CARRY8(uVar22,uVar11) +
           (lVar15 >> 0x33) + (ulong)CARRY8(uVar23,uVar8);
  uVar9 = lVar15 * 0x2000 | uVar7 >> 0x33;
  uVar8 = uVar25 + uVar9;
  uVar9 = (uVar17 & 0x7ffffffffffff) +
          ((SUB168(SEXT816(*in_RSI) * SEXT816(in_RSI[4] * 2),8) +
            SUB168(SEXT816(lVar2) * SEXT816(in_RSI[3]),8) + (ulong)CARRY8(uVar12,uVar13) +
            SUB168(SEXT816(lVar1) * SEXT816(lVar1),8) + (ulong)CARRY8(uVar24,lVar1 * lVar1) +
            (lVar15 >> 0x33) + (ulong)CARRY8(uVar25,uVar9)) * 0x2000 | uVar8 >> 0x33) * 0x13;
  in_RDI[1] = (uVar26 & 0x7ffffffffffff) + ((long)uVar9 >> 0x33);
  *in_RDI = uVar9 & 0x7ffffffffffff;
  in_RDI[2] = uVar16 & 0x7ffffffffffff;
  in_RDI[3] = uVar7 & 0x7ffffffffffff;
  in_RDI[4] = uVar8 & 0x7ffffffffffff;
  return;
}

Assistant:

void
fld_sq(fld_t res, const fld_t x)
{
	limb_t x2_1, x2_2, x2_3, x2_4, x19_3, x19_4, tmp;
	llimb_t c[5];

	x2_1 = 2*x[1];
	x2_2 = 2*x[2];
	x2_3 = 2*x[3];
	x2_4 = 2*x[4];
	x19_3 = 19*x[3];
	x19_4 = 19*x[4];

	c[0] = (llimb_t)x[0]*x[0] + (llimb_t)x2_1*x19_4 + (llimb_t)x2_2*x19_3;
	c[1] = (llimb_t)x[0]*x2_1 + (llimb_t)x2_2*x19_4 + (llimb_t)x19_3*x[3];
	c[2] = (llimb_t)x[0]*x2_2 + (llimb_t)x[1]*x[1] + (llimb_t)x2_3*x19_4;
	c[3] = (llimb_t)x[0]*x2_3 + (llimb_t)x2_1*x[2] + (llimb_t)x19_4*x[4];
	c[4] = (llimb_t)x[0]*x2_4 + (llimb_t)x2_1*x[3] + (llimb_t)x[2]*x[2];

	c[1] += c[0] >> FLD_LIMB_BITS;
	c[2] += c[1] >> FLD_LIMB_BITS;
	c[3] += c[2] >> FLD_LIMB_BITS;
	c[4] += c[3] >> FLD_LIMB_BITS;

	tmp = (c[0] & FLD_LIMB_MASK) + 19*(c[4] >> FLD_LIMB_BITS);
	res[1] = (c[1] & FLD_LIMB_MASK) + (tmp >> FLD_LIMB_BITS);

	res[0] = tmp & FLD_LIMB_MASK;
	res[2] = c[2] & FLD_LIMB_MASK;
	res[3] = c[3] & FLD_LIMB_MASK;
	res[4] = c[4] & FLD_LIMB_MASK;
}